

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

void __thiscall QUrlQuery::removeQueryItem(QUrlQuery *this,QString *key)

{
  bool bVar1;
  QUrlQueryPrivate *pQVar2;
  iterator o;
  pair<QString,_QString> *in_RDI;
  long in_FS_OFFSET;
  QUrlQueryPrivate *p;
  iterator it;
  const_iterator pos;
  QUrlQueryPrivate *in_stack_ffffffffffffffe0;
  const_iterator local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pos.i = in_RDI;
  pQVar2 = QSharedDataPointer<QUrlQueryPrivate>::constData
                     ((QSharedDataPointer<QUrlQueryPrivate> *)0x3152cf);
  if (pQVar2 != (QUrlQueryPrivate *)0x0) {
    QSharedDataPointer<QUrlQueryPrivate>::data((QSharedDataPointer<QUrlQueryPrivate> *)in_RDI);
    local_10.i = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QUrlQueryPrivate::findKey(in_stack_ffffffffffffffe0,&(pos.i)->first);
    o = QList<std::pair<QString,_QString>_>::end(in_RDI);
    bVar1 = QList<std::pair<QString,_QString>_>::iterator::operator!=(&local_10,o);
    if (bVar1) {
      QList<std::pair<QString,_QString>_>::const_iterator::const_iterator(&local_18,local_10);
      QList<std::pair<QString,_QString>_>::erase((QList<std::pair<QString,_QString>_> *)o.i,pos);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlQuery::removeQueryItem(const QString &key)
{
    if (d.constData()) {
        auto *p = d.data();
        Map::iterator it = p->findKey(key);
        if (it != p->itemList.end())
            p->itemList.erase(it);
    }
}